

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DefaultClockingReferenceSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DefaultClockingReferenceSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *local_80;
  size_t index_local;
  DefaultClockingReferenceSyntax *this_local;
  
  switch(index) {
  case 0:
    local_80 = (SyntaxNode *)0x0;
    if (this != (DefaultClockingReferenceSyntax *)0xfffffffffffffff0) {
      local_80 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 1:
    token.kind = (this->defaultKeyword).kind;
    token._2_1_ = (this->defaultKeyword).field_0x2;
    token.numFlags.raw = (this->defaultKeyword).numFlags.raw;
    token.rawLen = (this->defaultKeyword).rawLen;
    token.info = (this->defaultKeyword).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    token_00.kind = (this->clocking).kind;
    token_00._2_1_ = (this->clocking).field_0x2;
    token_00.numFlags.raw = (this->clocking).numFlags.raw;
    token_00.rawLen = (this->clocking).rawLen;
    token_00.info = (this->clocking).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    token_01.kind = (this->name).kind;
    token_01._2_1_ = (this->name).field_0x2;
    token_01.numFlags.raw = (this->name).numFlags.raw;
    token_01.rawLen = (this->name).rawLen;
    token_01.info = (this->name).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 4:
    token_02.kind = (this->semi).kind;
    token_02._2_1_ = (this->semi).field_0x2;
    token_02.numFlags.raw = (this->semi).numFlags.raw;
    token_02.rawLen = (this->semi).rawLen;
    token_02.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DefaultClockingReferenceSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return defaultKeyword;
        case 2: return clocking;
        case 3: return name;
        case 4: return semi;
        default: return nullptr;
    }
}